

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  char cVar1;
  reference pvVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_requant_out;
  float scale_requant_in;
  float bias0;
  char *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int w;
  float in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  Mat *in_stack_fffffffffffffea8;
  float local_14c;
  int local_138;
  int local_134;
  Mat local_108;
  Mat *local_c8;
  char *local_c0;
  value_type local_b4;
  value_type local_b0;
  float local_ac;
  char *local_a8;
  Mat local_a0;
  int local_5c;
  float *local_58;
  char *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  Mat *local_20;
  
  local_34 = *(int *)(in_RDI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x2c);
  local_3c = *(int *)(in_RSI + 0x30);
  local_40 = *(int *)(in_RSI + 0x34);
  local_44 = local_34 * 2 + local_38 * -2;
  local_20 = in_RCX;
  local_50 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_58 = Mat::operator_cast_to_float_(local_20);
  for (local_5c = 0; local_5c < local_40; local_5c = local_5c + 1) {
    Mat::channel(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    local_a8 = Mat::operator_cast_to_signed_char_(&local_a0);
    if (local_58 == (float *)0x0) {
      local_14c = 0.0;
    }
    else {
      local_14c = local_58[local_5c];
    }
    local_ac = local_14c;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)(local_5c * 2));
    local_b0 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)(local_5c * 2 + 1));
    local_b4 = *pvVar2;
    local_c0 = local_50 + local_5c * 9;
    Mat::channel(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    in_stack_fffffffffffffea8 = (Mat *)Mat::operator_cast_to_signed_char_(&local_108);
    Mat::~Mat((Mat *)0x18c440);
    local_c8 = in_stack_fffffffffffffea8;
    for (local_134 = 0; local_134 < local_3c; local_134 = local_134 + 1) {
      for (local_138 = local_38; 0 < local_138; local_138 = local_138 + -1) {
        cVar1 = float2int8(in_stack_fffffffffffffea0);
        in_stack_fffffffffffffea4 = CONCAT13(cVar1,(int3)in_stack_fffffffffffffea4);
        *local_a8 = cVar1;
        local_a8 = local_a8 + 1;
      }
    }
    Mat::~Mat((Mat *)0x18c709);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2*p];      
        const float scale_requant_out = scales_requant[2*p+1]; 

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}